

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_priority_queue.c
# Opt level: O3

void percolate_down(roaring_pq_t *pq,uint32_t i)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  roaring_bitmap_t *prVar4;
  roaring_pq_element_t *prVar5;
  _Bool _Var6;
  undefined7 uVar7;
  roaring_pq_element_t *prVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  undefined8 local_38;
  roaring_bitmap_t *prStack_30;
  
  uVar2 = (uint)pq->size;
  uVar9 = uVar2 >> 1;
  prVar8 = pq->elements;
  uVar3 = prVar8[i].size;
  prVar5 = prVar8 + i;
  _Var6 = prVar5->is_temporary;
  uVar7 = *(undefined7 *)&prVar5->field_0x9;
  prVar4 = *(roaring_bitmap_t **)(&prVar5->is_temporary + 8);
  if (i < uVar9) {
    do {
      uVar10 = i * 2 + 1;
      uVar1 = i * 2 + 2;
      prVar8 = pq->elements;
      uVar11 = prVar8[uVar10].size;
      local_38 = *(undefined8 *)&prVar8[uVar10].is_temporary;
      prStack_30 = *(roaring_bitmap_t **)(&prVar8[uVar10].is_temporary + 8);
      if (uVar1 < uVar2) {
        if (prVar8[uVar1].size < uVar11) {
          local_38 = *(undefined8 *)&prVar8[uVar1].is_temporary;
          prStack_30 = prVar8[uVar1].bitmap;
          uVar11 = prVar8[uVar1].size;
          uVar10 = uVar1;
        }
      }
      if (uVar3 <= uVar11) goto LAB_00126ed3;
      prVar8[i].size = uVar11;
      *(undefined8 *)&prVar8[i].is_temporary = local_38;
      *(roaring_bitmap_t **)(&prVar8[i].is_temporary + 8) = prStack_30;
      i = uVar10;
    } while (uVar10 < uVar9);
    prVar8 = pq->elements;
  }
LAB_00126ed3:
  prVar8[i].size = uVar3;
  prVar8 = prVar8 + i;
  prVar8->is_temporary = _Var6;
  *(undefined7 *)&prVar8->field_0x9 = uVar7;
  *(roaring_bitmap_t **)(&prVar8->is_temporary + 8) = prVar4;
  return;
}

Assistant:

static void percolate_down(roaring_pq_t *pq, uint32_t i) {
    uint32_t size = (uint32_t)pq->size;
    uint32_t hsize = size >> 1;
    roaring_pq_element_t ai = pq->elements[i];
    while (i < hsize) {
        uint32_t l = (i << 1) + 1;
        uint32_t r = l + 1;
        roaring_pq_element_t bestc = pq->elements[l];
        if (r < size) {
            if (compare(pq->elements + r, &bestc)) {
                l = r;
                bestc = pq->elements[r];
            }
        }
        if (!compare(&bestc, &ai)) {
            break;
        }
        pq->elements[i] = bestc;
        i = l;
    }
    pq->elements[i] = ai;
}